

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cc
# Opt level: O0

void __thiscall
RVO::RVOSimulator::setAgentDefaults
          (RVOSimulator *this,float neighborDist,size_t maxNeighbors,float timeHorizon,float radius,
          float maxSpeed,Vector3 *velocity)

{
  RVOSimulator *in_RSI;
  long *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM3_Da;
  Vector3 *in_stack_ffffffffffffffa8;
  Vector3 *in_stack_ffffffffffffffb0;
  undefined4 in_stack_fffffffffffffff0;
  
  if (*in_RDI == 0) {
    in_stack_ffffffffffffffb0 = (Vector3 *)operator_new(0x88);
    Agent::Agent((Agent *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffff0),in_RSI);
    *in_RDI = (long)in_stack_ffffffffffffffb0;
  }
  *(RVOSimulator **)(*in_RDI + 0x40) = in_RSI;
  *(undefined4 *)(*in_RDI + 0x48) = in_XMM3_Da;
  *(undefined4 *)(*in_RDI + 0x4c) = in_XMM0_Da;
  *(undefined4 *)(*in_RDI + 0x50) = in_XMM2_Da;
  *(undefined4 *)(*in_RDI + 0x54) = in_XMM1_Da;
  Vector3::operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void RVOSimulator::setAgentDefaults(float neighborDist,
                                    std::size_t maxNeighbors, float timeHorizon,
                                    float radius, float maxSpeed,
                                    const Vector3 &velocity) {
  if (defaultAgent_ == NULL) {
    defaultAgent_ = new Agent(this);
  }

  defaultAgent_->maxNeighbors_ = maxNeighbors;
  defaultAgent_->maxSpeed_ = maxSpeed;
  defaultAgent_->neighborDist_ = neighborDist;
  defaultAgent_->radius_ = radius;
  defaultAgent_->timeHorizon_ = timeHorizon;
  defaultAgent_->velocity_ = velocity;
}